

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::overlap_iterator::
nextOverlap(overlap_iterator *this)

{
  uint uVar1;
  pointer pEVar2;
  ulong uVar3;
  size_type sVar4;
  uint uVar6;
  ulong *puVar7;
  uint uVar8;
  ulong uVar9;
  size_type sVar5;
  
  pEVar2 = (this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar4 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((int)sVar4 == 1) {
    uVar8 = pEVar2[sVar4 - 1].offset;
LAB_007c2f0e:
    pEVar2[sVar4 - 1].offset = uVar8 + 1;
    return;
  }
  uVar6 = (int)sVar4 - 1;
  uVar3 = (this->searchKey).right;
  sVar5 = sVar4;
LAB_007c2f25:
  sVar4 = sVar5 - 1;
  (this->super_iterator).super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = sVar4;
  uVar6 = uVar6 - 1;
  uVar1 = pEVar2[sVar5 - 2].size;
  uVar8 = pEVar2[sVar5 - 2].offset;
  if (uVar8 < uVar1 - 1) {
    uVar9 = (ulong)uVar8 + 1;
    uVar8 = uVar1;
    if (uVar6 == 0) {
      if ((uint)uVar9 < uVar1) {
        puVar7 = (ulong *)((long)pEVar2->node + uVar9 * 0x10 + 0x48);
        do {
          if (uVar3 < puVar7[-1]) break;
          if ((this->searchKey).left <= *puVar7) goto LAB_007c2fd5;
          uVar9 = uVar9 + 1;
          puVar7 = puVar7 + 2;
        } while (uVar1 != uVar9);
      }
    }
    else if ((uint)uVar9 < uVar1) {
      puVar7 = (ulong *)((long)pEVar2[uVar6].node + uVar9 * 0x10 + 0x48);
      do {
        if (uVar3 < puVar7[-1]) break;
        if ((this->searchKey).left <= *puVar7) goto LAB_007c2fd5;
        uVar9 = uVar9 + 1;
        puVar7 = puVar7 + 2;
      } while (uVar1 != uVar9);
    }
    pEVar2[sVar5 - 2].offset = uVar1;
  }
  goto LAB_007c2fc7;
LAB_007c2fd5:
  pEVar2[sVar5 - 2].offset = (uint)uVar9;
  if (uVar1 != (uint)uVar9) {
    treeFind(this);
    return;
  }
LAB_007c2fc7:
  sVar5 = sVar4;
  if ((int)sVar4 == 1) goto LAB_007c2f0e;
  goto LAB_007c2f25;
}

Assistant:

void transferToRightSib(uint32_t size, NodeBase& sib, uint32_t sibSize, uint32_t count) {
        sib.moveRight(0, count, sibSize);
        sib.copy(*this, size - count, 0, count);
    }